

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall
QListModeViewBase::perItemScrollToValue
          (QListModeViewBase *this,int index,int scrollValue,int viewportSize,ScrollHint hint,
          Orientation orientation,bool wrap,int itemExtent)

{
  iterator __last;
  bool bVar1;
  int iVar2;
  Flow FVar3;
  int iVar4;
  qsizetype qVar5;
  const_reference piVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QCommonListViewBase *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  int in_stack_00000010;
  int segmentCount;
  int bottomCoordinate_1;
  int rightSegment;
  int leftSegment;
  int segment;
  Orientation flowOrientation;
  int itemCount;
  int bottomCoordinate;
  int bottomIndex;
  int topIndex;
  int i;
  int hiddenRowsBefore;
  QList<int> hiddenRows;
  qsizetype in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int iVar7;
  undefined4 in_stack_ffffffffffffff34;
  iterator in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_88;
  int local_6c;
  int local_68;
  int local_64;
  int local_2c;
  QList<int> local_28;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_EDX;
  if (-1 < in_ESI) {
    local_c = in_ESI;
    iVar2 = QCommonListViewBase::spacing((QCommonListViewBase *)0x881ec4);
    in_stack_00000010 = iVar2 + in_stack_00000010;
    local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QListViewPrivate::hiddenRowIds
              ((QListViewPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    QList<int>::begin((QList<int> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QList<int>::end((QList<int> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    __last.i._4_4_ = in_stack_ffffffffffffff34;
    __last.i._0_4_ = in_stack_ffffffffffffff30;
    std::sort<QList<int>::iterator>(in_stack_ffffffffffffff38,__last);
    local_68 = 0;
    for (local_64 = 0;
        (qVar5 = QList<int>::size(&local_28), (long)local_68 < qVar5 + -1 &&
        (piVar6 = QList<int>::at((QList<int> *)
                                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                 in_stack_ffffffffffffff18), *piVar6 <= local_c + local_64));
        local_64 = local_64 + 1) {
      local_68 = local_68 + 1;
    }
    iVar2 = local_c;
    if ((in_stack_00000008 & 1) == 0) {
      local_6c = local_c;
      piVar6 = QList<int>::at((QList<int> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
      iVar4 = *piVar6;
      while( true ) {
        bVar1 = false;
        if (0 < local_6c) {
          piVar6 = QList<int>::at((QList<int> *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                  in_stack_ffffffffffffff18);
          bVar1 = (iVar4 - *piVar6) + in_stack_00000010 <= in_ECX;
        }
        if (!bVar1) break;
        local_6c = local_6c + -1;
        while( true ) {
          bVar1 = false;
          if (0 < local_64) {
            piVar6 = QList<int>::at((QList<int> *)
                                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                    in_stack_ffffffffffffff18);
            bVar1 = local_6c + local_64 + -1 <= *piVar6;
          }
          if (!bVar1) break;
          local_64 = local_64 + -1;
        }
      }
      iVar2 = (iVar2 - local_6c) + 1;
      if (in_R8D == 1) {
        local_2c = local_c;
      }
      else if (in_R8D == 2) {
        local_2c = (local_c - iVar2) + 1;
      }
      else if (in_R8D == 3) {
        local_2c = local_c - iVar2 / 2;
      }
    }
    else {
      FVar3 = QCommonListViewBase::flow(in_RDI);
      iVar2 = 2;
      if (FVar3 == LeftToRight) {
        iVar2 = 1;
      }
      if (iVar2 == in_R9D) {
        piVar6 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff18);
        local_2c = *piVar6;
      }
      else {
        bVar1 = QList<int>::isEmpty((QList<int> *)0x882219);
        if (!bVar1) {
          QList<int>::size((QList<int> *)&in_RDI[2].dd);
          iVar4 = qBinarySearch<int>((QList<int> *)
                                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                     (int *)CONCAT44(in_stack_ffffffffffffff2c,
                                                     in_stack_ffffffffffffff28),
                                     in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
          piVar6 = QList<int>::at((QList<int> *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                  in_stack_ffffffffffffff18);
          iVar2 = *piVar6;
          local_88 = iVar4;
          while( true ) {
            bVar1 = false;
            if (in_EDX < local_88) {
              iVar7 = iVar2;
              piVar6 = QList<int>::at((QList<int> *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff18);
              bVar1 = (iVar7 - *piVar6) + in_stack_00000010 <= in_ECX;
            }
            if (!bVar1) break;
            local_88 = local_88 + -1;
          }
          iVar2 = (iVar4 - local_88) + 1;
          local_2c = iVar4;
          if (in_R8D != 1) {
            if (in_R8D == 2) {
              local_2c = (iVar4 - iVar2) + 1;
            }
            else {
              local_2c = in_EDX;
              if (in_R8D == 3) {
                local_2c = iVar4 - iVar2 / 2;
              }
            }
          }
        }
      }
    }
    QList<int>::~QList((QList<int> *)0x8823ab);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

int QListModeViewBase::perItemScrollToValue(int index, int scrollValue, int viewportSize,
                                                 QAbstractItemView::ScrollHint hint,
                                                 Qt::Orientation orientation, bool wrap, int itemExtent) const
{
    if (index < 0)
        return scrollValue;

    itemExtent += spacing();
    QList<int> hiddenRows = dd->hiddenRowIds();
    std::sort(hiddenRows.begin(), hiddenRows.end());
    int hiddenRowsBefore = 0;
    for (int i = 0; i < hiddenRows.size() - 1; ++i)
        if (hiddenRows.at(i) > index + hiddenRowsBefore)
            break;
        else
            ++hiddenRowsBefore;
    if (!wrap) {
        int topIndex = index;
        const int bottomIndex = topIndex;
        const int bottomCoordinate = flowPositions.at(index + hiddenRowsBefore);
        while (topIndex > 0 &&
               (bottomCoordinate - flowPositions.at(topIndex + hiddenRowsBefore - 1) + itemExtent) <= (viewportSize)) {
            topIndex--;
            // will the next one be a hidden row -> skip
            while (hiddenRowsBefore > 0 && hiddenRows.at(hiddenRowsBefore - 1) >= topIndex + hiddenRowsBefore - 1)
                hiddenRowsBefore--;
        }

        const int itemCount = bottomIndex - topIndex + 1;
        switch (hint) {
        case QAbstractItemView::PositionAtTop:
            return index;
        case QAbstractItemView::PositionAtBottom:
            return index - itemCount + 1;
        case QAbstractItemView::PositionAtCenter:
            return index - (itemCount / 2);
        default:
            break;
        }
    } else { // wrapping
        Qt::Orientation flowOrientation = (flow() == QListView::LeftToRight
                                           ? Qt::Horizontal : Qt::Vertical);
        if (flowOrientation == orientation) { // scrolling in the "flow" direction
            // ### wrapped scrolling in the flow direction
            return flowPositions.at(index + hiddenRowsBefore); // ### always pixel based for now
        } else if (!segmentStartRows.isEmpty()) { // we are scrolling in the "segment" direction
            int segment = qBinarySearch<int>(segmentStartRows, index, 0, segmentStartRows.size() - 1);
            int leftSegment = segment;
            const int rightSegment = leftSegment;
            const int bottomCoordinate = segmentPositions.at(segment);

            while (leftSegment > scrollValue &&
                (bottomCoordinate - segmentPositions.at(leftSegment-1) + itemExtent) <= (viewportSize)) {
                    leftSegment--;
            }

            const int segmentCount = rightSegment - leftSegment + 1;
            switch (hint) {
            case QAbstractItemView::PositionAtTop:
                return segment;
            case QAbstractItemView::PositionAtBottom:
                return segment - segmentCount + 1;
            case QAbstractItemView::PositionAtCenter:
                return segment - (segmentCount / 2);
            default:
                break;
            }
        }
    }
    return scrollValue;
}